

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_arith64(ASMState *as,IRIns *ir,IRCallID id)

{
  uint in_EDX;
  ASMState *in_RSI;
  IRRef args [2];
  CCallInfo *ci;
  undefined4 in_stack_00000010;
  undefined4 in_stack_ffffffffffffffe8;
  
  asm_setupresult(in_RSI,(IRIns *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),lj_ir_callinfo + in_EDX
                 );
  asm_gencall((ASMState *)&ir->field_0,(CCallInfo *)CONCAT44(id,in_stack_00000010),(IRRef *)ci);
  return;
}

Assistant:

static void asm_arith64(ASMState *as, IRIns *ir, IRCallID id)
{
  const CCallInfo *ci = &lj_ir_callinfo[id];
  IRRef args[2];
  args[0] = ir->op1;
  args[1] = ir->op2;
  asm_setupresult(as, ir, ci);
  asm_gencall(as, ci, args);
}